

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

error_code llvm::errorToErrorCode(Error *Err)

{
  bool bVar1;
  error_code eVar2;
  string local_60;
  error_code local_40;
  anon_class_8_1_3fcf615c local_30;
  Error local_28;
  Error *local_20;
  Error *Err_local;
  error_code EC;
  
  local_20 = Err;
  std::error_code::error_code((error_code *)&Err_local);
  Error::Error(&local_28,Err);
  local_30.EC = (error_code *)&Err_local;
  handleAllErrors<llvm::errorToErrorCode(llvm::Error)::__0>(&local_28,&local_30);
  Error::~Error(&local_28);
  eVar2 = inconvertibleErrorCode();
  local_40._M_cat = eVar2._M_cat;
  local_40._M_value = eVar2._M_value;
  bVar1 = std::operator==((error_code *)&Err_local,&local_40);
  if (!bVar1) {
    eVar2._4_4_ = 0;
    eVar2._M_value = (uint)Err_local;
    eVar2._M_cat = (error_category *)EC._0_8_;
    return eVar2;
  }
  std::error_code::message_abi_cxx11_(&local_60,(error_code *)&Err_local);
  report_fatal_error(&local_60,true);
}

Assistant:

std::error_code errorToErrorCode(Error Err) {
  std::error_code EC;
  handleAllErrors(std::move(Err), [&](const ErrorInfoBase &EI) {
    EC = EI.convertToErrorCode();
  });
  if (EC == inconvertibleErrorCode())
    report_fatal_error(EC.message());
  return EC;
}